

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

bool __thiscall duckdb::Expression::PropagatesNullValues(Expression *this)

{
  anon_class_8_1_280ccbe4 *in_RDI;
  bool propagate_null_values;
  function<void_(const_duckdb::Expression_&)> *in_stack_ffffffffffffffb0;
  function<void_(const_duckdb::Expression_&)> *in_stack_ffffffffffffffd8;
  Expression *in_stack_ffffffffffffffe0;
  bool local_1;
  
  if ((((*(char *)&in_RDI[1].propagate_null_values == '\x0e') ||
       (*(char *)&in_RDI[1].propagate_null_values == '\x0f')) ||
      (*(char *)&in_RDI[1].propagate_null_values == '(')) ||
     (((*(char *)&in_RDI[1].propagate_null_values == '%' ||
       (*(char *)&in_RDI[1].propagate_null_values == '3')) ||
      ((*(char *)&in_RDI[1].propagate_null_values == '2' ||
       (*(char *)&in_RDI[1].propagate_null_values == -0x68)))))) {
    local_1 = false;
  }
  else {
    ::std::function<void(duckdb::Expression_const&)>::
    function<duckdb::Expression::PropagatesNullValues()const::__0,void>
              (in_stack_ffffffffffffffb0,in_RDI);
    ExpressionIterator::EnumerateChildren(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    ::std::function<void_(const_duckdb::Expression_&)>::~function
              ((function<void_(const_duckdb::Expression_&)> *)0xe702e0);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Expression::PropagatesNullValues() const {
	if (type == ExpressionType::OPERATOR_IS_NULL || type == ExpressionType::OPERATOR_IS_NOT_NULL ||
	    type == ExpressionType::COMPARE_NOT_DISTINCT_FROM || type == ExpressionType::COMPARE_DISTINCT_FROM ||
	    type == ExpressionType::CONJUNCTION_OR || type == ExpressionType::CONJUNCTION_AND ||
	    type == ExpressionType::OPERATOR_COALESCE) {
		return false;
	}
	bool propagate_null_values = true;
	ExpressionIterator::EnumerateChildren(*this, [&](const Expression &child) {
		if (!child.PropagatesNullValues()) {
			propagate_null_values = false;
		}
	});
	return propagate_null_values;
}